

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int asl::utf16toUtf8(wchar_t *p,char *u,int n)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  
  iVar4 = (int)u;
  while (wVar1 = *p, wVar1 != L'\0') {
    pwVar3 = p + 1;
    bVar5 = (byte)wVar1;
    if (wVar1 < L'\x80') {
      *u = bVar5;
      u = (char *)((byte *)u + 1);
    }
    else if ((uint)wVar1 < 0x800) {
      *u = (byte)((uint)wVar1 >> 6) | 0xc0;
      ((byte *)u)[1] = bVar5 & 0x3f | 0x80;
      u = (char *)((byte *)u + 2);
    }
    else if ((uint)(wVar1 + L'\xffff2000') < 0xfffff800) {
      *u = (byte)((uint)wVar1 >> 0xc) | 0xe0;
      ((byte *)u)[1] = (byte)((uint)wVar1 >> 6) & 0x3f | 0x80;
      ((byte *)u)[2] = bVar5 & 0x3f | 0x80;
      u = (char *)((byte *)u + 3);
    }
    else {
      if ((0xdbff < (uint)wVar1) || (wVar2 = *pwVar3, (wVar2 & 0xfffffc00U) != 0xdc00)) break;
      pwVar3 = p + 2;
      uVar6 = wVar1 * 0x400 + wVar2 + 0xfca02400;
      *u = (byte)(uVar6 >> 0x12) | 0xf0;
      ((byte *)u)[1] = (byte)(uVar6 >> 0xc) & 0x3f | 0x80;
      ((byte *)u)[2] = (byte)((uint)(wVar2 + wVar1 * 0x400 + 0x400U) >> 6) & 0x3f | 0x80;
      ((byte *)u)[3] = (byte)wVar2 & 0x3f | 0x80;
      u = (char *)((byte *)u + 4);
    }
    n = n + -1;
    p = pwVar3;
    if (n == 0) break;
  }
  *u = 0;
  return (int)u - iVar4;
}

Assistant:

int utf16toUtf8(const wchar_t* p, char* u, int n)
{
	const char* u0 = u;
	while(wchar_t c = *p++) {
		if(c < 0x80) {
			*u++ = c & 0xff;
		}
		else if (c < 0x0800) {
			*u++ = (c >> 6 | 0xC0);
			*u++ = ((c & 0x3F) | 0x80);
		}
		else if (c < 0xd800 || c > 0xdfff) {
			*u++ = (c >> 12 | 0xE0);
			*u++ = ((c >> 6 & 0x3F) | 0x80);
			*u++ = ((c & 0x3F) | 0x80);
		}
		else if (c < 0xdc00) { // 1st surrogate
			int c2 = *p++;
			if (c2 < 0xdc00 || c2 > 0xdfff)
				break;
			unsigned int d = ((((unsigned int)c - 0xd800) << 10) | (c2 - 0xdc00)) + 0x10000;
			*u++ = (d >> 18 | 0xF0);
			*u++ = ((d >> 12 & 0x3F) | 0x80);
			*u++ = ((d >> 6 & 0x3F) | 0x80);
			*u++ = ((d & 0x3F) | 0x80);
		}
		else
			break;
		if (--n == 0)
			break;
	}
	*u='\0';
	return int(u - u0);
}